

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  uint local_14;
  
  pcVar1 = ImParseFormatFindStart(fmt);
  if (*pcVar1 != '%') {
    return default_precision;
  }
  pcVar1 = pcVar1 + 1;
  do {
    cVar3 = *pcVar1;
    pcVar1 = pcVar1 + 1;
  } while ((byte)(cVar3 - 0x30U) < 10);
  local_14 = 0x7fffffff;
  uVar2 = 0x7fffffff;
  if (cVar3 == '.') {
    pcVar1 = ImAtoi<int>(pcVar1,(int *)&local_14);
    uVar2 = local_14;
    if (99 < local_14) {
      uVar2 = default_precision;
    }
    cVar3 = *pcVar1;
  }
  if ((cVar3 != 'E') && (cVar3 != 'e')) {
    if (cVar3 == 'g') {
      if (uVar2 != 0x7fffffff) {
        return uVar2;
      }
    }
    else if ((cVar3 != 'G') || (uVar2 != 0x7fffffff)) {
      if (uVar2 != 0x7fffffff) {
        return uVar2;
      }
      return default_precision;
    }
  }
  return -1;
}

Assistant:

int ImParseFormatPrecision(const char* fmt, int default_precision)
{
    fmt = ImParseFormatFindStart(fmt);
    if (fmt[0] != '%')
        return default_precision;
    fmt++;
    while (*fmt >= '0' && *fmt <= '9')
        fmt++;
    int precision = INT_MAX;
    if (*fmt == '.')
    {
        fmt = ImAtoi<int>(fmt + 1, &precision);
        if (precision < 0 || precision > 99)
            precision = default_precision;
    }
    if (*fmt == 'e' || *fmt == 'E') // Maximum precision with scientific notation
        precision = -1;
    if ((*fmt == 'g' || *fmt == 'G') && precision == INT_MAX)
        precision = -1;
    return (precision == INT_MAX) ? default_precision : precision;
}